

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

int google::protobuf::compiler::java::GetExperimentalJavaFieldTypeForPacked(FieldDescriptor *field)

{
  string *value;
  LogMessage *pLVar1;
  LogFinisher local_65 [13];
  LogMessage local_58;
  Type local_1c;
  FieldDescriptor *pFStack_18;
  int result;
  FieldDescriptor *field_local;
  
  pFStack_18 = field;
  local_1c = FieldDescriptor::type(field);
  if ((int)local_1c < 9) {
    field_local._4_4_ = local_1c + 0x22;
  }
  else if ((int)local_1c < 0xd) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_helpers.cc"
               ,0x401);
    value = FieldDescriptor::full_name_abi_cxx11_(pFStack_18);
    pLVar1 = internal::LogMessage::operator<<(&local_58,value);
    pLVar1 = internal::LogMessage::operator<<(pLVar1," can\'t be packed.");
    internal::LogFinisher::operator=(local_65,pLVar1);
    internal::LogMessage::~LogMessage(&local_58);
    field_local._4_4_ = 0;
  }
  else {
    field_local._4_4_ = local_1c + (TYPE_SFIXED64|TYPE_ENUM);
  }
  return field_local._4_4_;
}

Assistant:

int GetExperimentalJavaFieldTypeForPacked(const FieldDescriptor* field) {
  int result = field->type();
  if (result < FieldDescriptor::TYPE_STRING) {
    return result + 34;
  } else if (result > FieldDescriptor::TYPE_BYTES) {
    return result + 30;
  } else {
    GOOGLE_LOG(FATAL) << field->full_name() << " can't be packed.";
    return 0;
  }
}